

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

void PaUtil_Set2ndInterleavedOutputChannels
               (PaUtilBufferProcessor *bp,uint firstChannel,void *data,uint channelCount)

{
  void *local_38;
  uchar *p;
  uint local_28;
  uint channel;
  uint i;
  uint channelCount_local;
  void *data_local;
  uint firstChannel_local;
  PaUtilBufferProcessor *bp_local;
  
  channel = channelCount;
  if (channelCount == 0) {
    channel = bp->outputChannelCount;
  }
  if (bp->outputChannelCount <= firstChannel) {
    __assert_fail("firstChannel < bp->outputChannelCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_process.c"
                  ,0x287,
                  "void PaUtil_Set2ndInterleavedOutputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
                 );
  }
  if (bp->outputChannelCount < firstChannel + channel) {
    __assert_fail("firstChannel + channelCount <= bp->outputChannelCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_process.c"
                  ,0x288,
                  "void PaUtil_Set2ndInterleavedOutputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
                 );
  }
  if (bp->hostOutputIsInterleaved != 0) {
    local_38 = data;
    for (local_28 = 0; local_28 < channel; local_28 = local_28 + 1) {
      PaUtil_Set2ndOutputChannel(bp,firstChannel + local_28,local_38,channel);
      local_38 = (void *)((long)local_38 + (ulong)bp->bytesPerHostOutputSample);
    }
    return;
  }
  __assert_fail("bp->hostOutputIsInterleaved",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_process.c"
                ,0x289,
                "void PaUtil_Set2ndInterleavedOutputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
               );
}

Assistant:

void PaUtil_Set2ndInterleavedOutputChannels( PaUtilBufferProcessor* bp,
        unsigned int firstChannel, void *data, unsigned int channelCount )
{
    unsigned int i;
    unsigned int channel = firstChannel;
    unsigned char *p = (unsigned char*)data;

    if( channelCount == 0 )
        channelCount = bp->outputChannelCount;

    assert( firstChannel < bp->outputChannelCount );
    assert( firstChannel + channelCount <= bp->outputChannelCount );
    assert( bp->hostOutputIsInterleaved );

    for( i=0; i< channelCount; ++i )
    {
        PaUtil_Set2ndOutputChannel( bp, channel + i, p, channelCount );
        p += bp->bytesPerHostOutputSample;
    }
}